

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

Socket * __thiscall asl::Socket::operator>>(Socket *this,longlong *x)

{
  SmartObject_ *pSVar1;
  
  pSVar1 = (this->super_SmartObject)._p;
  (*pSVar1->_vptr_SmartObject_[0xd])(pSVar1,x,8);
  if (*(int *)((long)&(this->super_SmartObject)._p[1]._vptr_SmartObject_ + 4) == 0) {
    swapBytes<long_long>(x);
  }
  return this;
}

Assistant:

Socket& operator>>(T& x)
	{
		read(&x, sizeof(x));
		if (endian() == ASL_OTHER_ENDIAN)
			swapBytes(x);
		return *this;
	}